

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall xray_re::xr_partition::xr_partition(xr_partition *this,xr_bone_vec *bones)

{
  pointer ppxVar1;
  pointer ppxVar2;
  allocator<char> local_29;
  
  this->_vptr_xr_partition = (_func_int **)&PTR__xr_partition_0023a5b8;
  this->m_id = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,"default",&local_29);
  (this->m_bones).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_bones).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_bones).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->m_bones,
            (long)(bones->
                  super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(bones->
                  super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  ppxVar1 = (bones->super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar2 = (bones->super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppxVar2 != ppxVar1;
      ppxVar2 = ppxVar2 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_bones,&(*ppxVar2)->m_name);
  }
  return;
}

Assistant:

xr_partition::xr_partition(const xr_bone_vec& bones): m_id(0), m_name("default")
{
	m_bones.reserve(bones.size());
	for (xr_bone_vec_cit it = bones.begin(), end = bones.end(); it != end; ++it)
		m_bones.push_back((*it)->name());
}